

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirABYTEZ(void)

{
  int iVar1;
  undefined8 in_RAX;
  aint add;
  
  add = (aint)((ulong)in_RAX >> 0x20);
  iVar1 = ParseExpressionNoSyntaxError(&lp,&add);
  if (iVar1 == 0) {
    Error("ABYTEZ <offset> <bytes>: parsing <offset> failed",bp,SUPPRESS);
  }
  else {
    Relocation::checkAndWarn(false);
    getBytesWithCheck(add,0,true);
  }
  return;
}

Assistant:

static void dirABYTEZ() {
	aint add;
	if (ParseExpressionNoSyntaxError(lp, add)) {
		Relocation::checkAndWarn();
		getBytesWithCheck(add, 0, true);
	} else {
		Error("ABYTEZ <offset> <bytes>: parsing <offset> failed", bp, SUPPRESS);
	}
}